

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O3

double __thiscall
ON_Interval::ClampedNormalizedParameterAt(ON_Interval *this,double interval_parameter)

{
  double dVar1;
  double dVar2;
  
  if (1.23432101234321e+308 <= ABS(interval_parameter)) {
    return ON_DBL_QNAN;
  }
  dVar1 = this->m_t[0];
  if (1.23432101234321e+308 <= ABS(dVar1)) {
    return ON_DBL_QNAN;
  }
  dVar2 = this->m_t[1];
  if (1.23432101234321e+308 <= ABS(dVar2)) {
    return ON_DBL_QNAN;
  }
  if (dVar2 <= dVar1) {
    if (dVar1 <= dVar2) {
      if (dVar1 <= interval_parameter) {
        return *(double *)(&DAT_006be0f0 + (ulong)(dVar2 < interval_parameter) * 8);
      }
      return 0.0;
    }
    if (dVar1 <= interval_parameter) {
      return 0.0;
    }
    if (interval_parameter <= dVar2) {
      return 1.0;
    }
  }
  else {
    if (interval_parameter <= dVar1) {
      return 0.0;
    }
    if (dVar2 <= interval_parameter) {
      return 1.0;
    }
  }
  return (interval_parameter - dVar1) / (dVar2 - dVar1);
}

Assistant:

double ON_Interval::ClampedNormalizedParameterAt(
  double interval_parameter
) const
{
  if (ON_IS_VALID(interval_parameter) && ON_IS_VALID(m_t[0]) && ON_IS_VALID(m_t[1]))
  {
    if (m_t[0] < m_t[1])
    {
      // this is an increasing interval
      if (interval_parameter <= m_t[0])
        return 0.0;
      if (interval_parameter >= m_t[1])
        return 1.0;
    }
    else if (m_t[0] > m_t[1])
    {
      // this is a decreasing interval
      if (interval_parameter >= m_t[0])
        return 0.0;
      if (interval_parameter <= m_t[1])
        return 1.0;
    }
    else
    {
      // this is a singleton interval
      if (interval_parameter < m_t[0])
        return 0.0;
      if (interval_parameter > m_t[1])
        return 1.0;
      return 0.5;
    }

    // the interval_parameter is strictly between m_t[0] and m_t[1]
    return (interval_parameter - m_t[0]) / (m_t[1] - m_t[0]);
  }

  return ON_DBL_QNAN;
}